

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

void __thiscall
branch_and_reduce_algorithm::compute_nd_order_cutter(branch_and_reduce_algorithm *this)

{
  return;
}

Assistant:

void branch_and_reduce_algorithm::compute_nd_order_cutter()
{
#ifdef USE_IFC
    double balance = TUNING_PARAM2;
    int nd_threshold = TUNING_PARAM1 >= 0 ? TUNING_PARAM1 : (int)(((double)(-TUNING_PARAM1) / 100.0) * rn);
    int max_level = (TUNING_PARAM3 > 0) ? TUNING_PARAM3 : floor(log2(n)) + TUNING_PARAM3;

    std::vector<std::vector<int>> new_adj;
    std::vector<int> map;
    std::vector<int> rev_map;
    convert_to_adj(new_adj, rev_map, map);

    std::vector<std::pair<int, std::vector<int>>> separators;
    get_nd_separators_cutter(new_adj, balance, separators);
    std::vector<std::vector<int>> separators_level(max_level);
    for (auto sep : separators)
    {
        int index = sep.first - 1;
        if (index < max_level)
        {
            if (sep.second.size() > nd_threshold)
                return;

            for (auto vtc : sep.second)
            {
                separators_level[index].push_back(rev_map[vtc]);
            }
        }
    }

    for (int i = separators_level.size() - 1; i >= 0; i--)
    {
        auto sep = separators_level[i];
        nd_order.insert(nd_order.end(), sep.begin(), sep.end());
    }
#endif
}